

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# damagebintocsv.cpp
# Opt level: O0

void damagebintocsv::doit(bool intervalType)

{
  size_t local_28;
  size_t i;
  damagebindictionary q;
  bool intervalType_local;
  
  q.interpolation._0_1_ = intervalType;
  printf("\"bin_index\", \"bin_from\", \"bin_to\", \"interpolation\"");
  if ((q.interpolation._0_1_ & 1) != 0) {
    printf(", \"interval_type\"");
  }
  printf("\n");
  local_28 = fread((void *)((long)&i + 3),0x14,1,_stdin);
  while (local_28 != 0) {
    printf("%d, %f, %f, %f",(double)stack0xffffffffffffffe7,(double)(float)q.bin_index,
           (double)q.bin_from,(ulong)i._3_4_);
    if ((q.interpolation._0_1_ & 1) != 0) {
      printf(", %d",(ulong)(uint)q.bin_to);
    }
    printf("\n");
    local_28 = fread((void *)((long)&i + 3),0x14,1,_stdin);
  }
  return;
}

Assistant:

void doit(bool intervalType)
	{
		printf("\"bin_index\", \"bin_from\", \"bin_to\", \"interpolation\"");
		if (intervalType) printf(", \"interval_type\"");
		printf("\n");

		damagebindictionary q;
		size_t i = fread(&q, sizeof(q), 1, stdin);
		while (i != 0) {
			printf("%d, %f, %f, %f",
				q.bin_index, q.bin_from, q.bin_to, q.interpolation);
			if (intervalType) printf(", %d", q.interval_type);
			printf("\n");

			i = fread(&q, sizeof(q), 1, stdin);
		}

	}